

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O1

void Handlers::Trade_Agree(Character *character,PacketReader *reader)

{
  short sVar1;
  _List_node_base *this;
  byte bVar2;
  int iVar3;
  _List_node_base *p_Var4;
  list<Character_Item,_std::allocator<Character_Item>_> *plVar5;
  PacketBuilder builder;
  PacketBuilder builder_1;
  PacketBuilder PStack_98;
  _List_node_base *local_68;
  PacketBuilder local_60;
  
  if (character->trading != true) {
    return;
  }
  bVar2 = PacketReader::GetChar(reader);
  character->trade_agree = bVar2 != 0;
  if (bVar2 == 0) {
    PacketBuilder::PacketBuilder(&PStack_98,PACKET_TRADE,PACKET_SPEC,1);
    PacketBuilder::AddChar(&PStack_98,0);
    Character::Send(character,&PStack_98);
    PacketBuilder::PacketBuilder(&local_60,PACKET_TRADE,PACKET_AGREE,3);
    iVar3 = Character::PlayerID(character->trade_partner);
    PacketBuilder::AddShort(&local_60,iVar3);
    PacketBuilder::AddChar(&local_60,0);
    Character::Send(character->trade_partner,&local_60);
  }
  else {
    if ((character->trade_inventory).
        super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&character->trade_inventory) {
      return;
    }
    if (character->trade_partner->trade_agree == true) {
      PacketBuilder::PacketBuilder
                (&PStack_98,PACKET_TRADE,PACKET_USE,
                 ((character->trade_inventory).
                  super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node.
                  _M_size +
                 (character->trade_partner->trade_inventory).
                 super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node.
                 _M_size) * 6 + 6);
      iVar3 = Character::PlayerID(character->trade_partner);
      PacketBuilder::AddShort(&PStack_98,iVar3);
      plVar5 = &character->trade_partner->trade_inventory;
      p_Var4 = (_List_node_base *)plVar5;
      local_68 = (_List_node_base *)&character->trade_inventory;
      while (p_Var4 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                       &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var4 != (_List_node_base *)plVar5) {
        iVar3 = *(int *)((long)&p_Var4[1]._M_next + 4);
        sVar1 = *(short *)&p_Var4[1]._M_next;
        PacketBuilder::AddShort(&PStack_98,(int)sVar1);
        PacketBuilder::AddInt(&PStack_98,iVar3);
        Character::DelItem(character->trade_partner,sVar1,iVar3);
        Character::AddItem(character,sVar1,iVar3);
      }
      PacketBuilder::AddByte(&PStack_98,0xff);
      this = local_68;
      iVar3 = Character::PlayerID(character);
      PacketBuilder::AddShort(&PStack_98,iVar3);
      p_Var4 = this;
      while (p_Var4 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                       &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var4 != this) {
        iVar3 = *(int *)((long)&p_Var4[1]._M_next + 4);
        sVar1 = *(short *)&p_Var4[1]._M_next;
        PacketBuilder::AddShort(&PStack_98,(int)sVar1);
        PacketBuilder::AddInt(&PStack_98,iVar3);
        Character::DelItem(character,sVar1,iVar3);
        Character::AddItem(character->trade_partner,sVar1,iVar3);
      }
      PacketBuilder::AddByte(&PStack_98,0xff);
      Character::Send(character,&PStack_98);
      Character::Send(character->trade_partner,&PStack_98);
      Character::Emote(character,EMOTE_TRADE,true);
      Character::Emote(character->trade_partner,EMOTE_TRADE,true);
      character->trading = false;
      std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                ((list<Character_Item,_std::allocator<Character_Item>_> *)this);
      character->trade_agree = false;
      Character::CheckQuestRules(character);
      Character::CheckQuestRules(character->trade_partner);
      character->trade_partner->trading = false;
      std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                (&character->trade_partner->trade_inventory);
      character->trade_agree = false;
      character->trade_partner->trade_partner = (Character *)0x0;
      character->trade_partner = (Character *)0x0;
      goto LAB_00169c77;
    }
    PacketBuilder::PacketBuilder(&PStack_98,PACKET_TRADE,PACKET_SPEC,1);
    PacketBuilder::AddChar(&PStack_98,(uint)bVar2);
    Character::Send(character,&PStack_98);
    PacketBuilder::PacketBuilder(&local_60,PACKET_TRADE,PACKET_AGREE,3);
    iVar3 = Character::PlayerID(character->trade_partner);
    PacketBuilder::AddShort(&local_60,iVar3);
    PacketBuilder::AddChar(&local_60,(uint)bVar2);
    Character::Send(character->trade_partner,&local_60);
  }
  PacketBuilder::~PacketBuilder(&local_60);
LAB_00169c77:
  PacketBuilder::~PacketBuilder(&PStack_98);
  return;
}

Assistant:

void Trade_Agree(Character *character, PacketReader &reader)
{
	if (!character->trading) return;

	int agree = reader.GetChar();

	character->trade_agree = agree;

	if (agree)
	{
		if (character->trade_inventory.empty())
		{
			return;
		}

		if (character->trade_partner->trade_agree)
		{
			PacketBuilder builder(PACKET_TRADE, PACKET_USE,
				6 + character->trade_partner->trade_inventory.size() * 6 + character->trade_inventory.size() * 6);

			builder.AddShort(character->trade_partner->PlayerID());
			UTIL_FOREACH(character->trade_partner->trade_inventory, item)
			{
				builder.AddShort(item.id);
				builder.AddInt(item.amount);
				character->trade_partner->DelItem(item.id, item.amount);
				character->AddItem(item.id, item.amount);
			}
			builder.AddByte(255);
			builder.AddShort(character->PlayerID());
			UTIL_FOREACH(character->trade_inventory, item)
			{
				builder.AddShort(item.id);
				builder.AddInt(item.amount);
				character->DelItem(item.id, item.amount);
				character->trade_partner->AddItem(item.id, item.amount);
			}
			builder.AddByte(255);
			character->Send(builder);
			character->trade_partner->Send(builder);

			character->Emote(EMOTE_TRADE);
			character->trade_partner->Emote(EMOTE_TRADE);

			character->trading = false;
			character->trade_inventory.clear();
			character->trade_agree = false;

			character->CheckQuestRules();
			character->trade_partner->CheckQuestRules();

			character->trade_partner->trading = false;
			character->trade_partner->trade_inventory.clear();
			character->trade_agree = false;

			character->trade_partner->trade_partner = 0;
			character->trade_partner = 0;
		}
		else
		{
			PacketBuilder reply(PACKET_TRADE, PACKET_SPEC, 1);
			reply.AddChar(agree);
			character->Send(reply);

			PacketBuilder builder(PACKET_TRADE, PACKET_AGREE, 3);
			builder.AddShort(character->trade_partner->PlayerID());
			builder.AddChar(agree);
			character->trade_partner->Send(builder);
		}
	}
	else
	{
		PacketBuilder reply(PACKET_TRADE, PACKET_SPEC, 1);
		reply.AddChar(agree);
		character->Send(reply);

		PacketBuilder builder(PACKET_TRADE, PACKET_AGREE, 3);
		builder.AddShort(character->trade_partner->PlayerID());
		builder.AddChar(agree);
		character->trade_partner->Send(builder);
	}
}